

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char cVar2;
  float *pfVar3;
  char *pcVar4;
  undefined8 *in_RCX;
  long in_RSI;
  Option *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char sums8_1;
  float scale_out_1;
  float sumfp32_1;
  float scale_in_1;
  char w_2;
  char val_1;
  int k_1;
  char *sptr_1;
  Mat m_1;
  int q_1;
  char *kptr_1;
  int sum_1;
  int j_2;
  int i_2;
  char *weight_data_ptr;
  char *outptr_1;
  int p;
  int g_2;
  int num_output_g;
  int channels_g_1;
  char sums8;
  float scale_out;
  float sumfp32;
  float scale_in;
  char w_1;
  char val;
  int k;
  char *sptr;
  int sum;
  int j_1;
  int i_1;
  Mat m;
  char *kptr;
  char *outptr;
  int g_1;
  size_t out_elemsize;
  bool use_int8_requantize;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Option opt_q;
  int q;
  float scale;
  int g;
  float *ps;
  Mat scales;
  int channels_g;
  Mat bottom_blob_int8;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  Mat *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  float in_stack_fffffffffffffb00;
  float in_stack_fffffffffffffb04;
  size_type in_stack_fffffffffffffb08;
  Mat *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  float in_stack_fffffffffffffb1c;
  float local_494;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  float fVar10;
  undefined2 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc02;
  undefined1 in_stack_fffffffffffffc03;
  undefined4 in_stack_fffffffffffffc04;
  int iVar11;
  Mat local_3f0;
  int local_3a4;
  char *local_3a0;
  int local_394;
  int local_390;
  int local_38c;
  char *local_388;
  Mat local_380;
  float *local_338;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  char local_31d;
  float local_31c;
  float local_318;
  float local_314;
  char local_30e;
  char local_30d;
  int local_30c;
  char *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  Mat local_2f0;
  char *local_2a8;
  Mat local_2a0;
  float *local_258;
  int local_24c;
  ulong local_248;
  byte local_23d;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  reference local_228;
  vector<int,_std::allocator<int>_> local_218;
  int local_200;
  int local_1fc;
  int local_1f8;
  undefined4 local_1f4;
  Mat local_1f0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  int local_15c;
  float local_158;
  int local_154;
  float *local_150;
  Mat local_138;
  int local_ec;
  int local_a0;
  int local_9c;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Mat *local_40;
  undefined4 local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  undefined4 local_8;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  local_84 = *(int *)(in_RSI + 0x2c);
  local_88 = *(int *)(in_RSI + 0x30);
  local_8c = *(int *)(in_RSI + 0x38);
  local_98 = *(long *)(in_RSI + 0x10);
  if ((local_8c % *(int *)&in_RDI[4].blob_allocator == 0) &&
     (*(int *)&in_RDI[3].workspace_allocator % *(int *)&in_RDI[4].blob_allocator == 0)) {
    local_9c = *(int *)&in_RDI[3].use_winograd_convolution *
               (*(int *)((long)&in_RDI[3].workspace_allocator + 4) + -1) + 1;
    local_a0 = *(int *)&in_RDI[3].use_bf16_storage * (in_RDI[3].openmp_blocktime + -1) + 1;
    local_80 = in_RCX;
    ncnn::Mat::Mat(in_stack_fffffffffffffaf0,
                   (Mat *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    if (local_98 != 1) {
      local_ec = local_8c / *(int *)&in_RDI[4].blob_allocator;
      ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                     in_stack_fffffffffffffafc,(size_t)in_stack_fffffffffffffaf0,
                     (Allocator *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
      local_150 = ncnn::Mat::operator_cast_to_float_(&local_138);
      for (local_154 = 0; local_154 < *(int *)&in_RDI[4].blob_allocator; local_154 = local_154 + 1)
      {
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 9),(long)local_154);
        local_158 = *pfVar3;
        for (local_15c = 0; local_15c < local_ec; local_15c = local_15c + 1) {
          *local_150 = local_158;
          local_150 = local_150 + 1;
        }
      }
      local_1a8 = *local_80;
      local_198 = *(undefined4 *)(local_80 + 2);
      uStack_194 = *(undefined4 *)((long)local_80 + 0x14);
      uStack_190 = *(undefined4 *)(local_80 + 3);
      uStack_18c = *(undefined4 *)((long)local_80 + 0x1c);
      local_188 = local_80[4];
      uStack_180 = local_80[5];
      local_178 = local_80[6];
      uStack_170 = local_80[7];
      uStack_1a0 = local_80[2];
      quantize_to_int8((Mat *)CONCAT44(in_stack_fffffffffffffc04,
                                       CONCAT13(in_stack_fffffffffffffc03,
                                                CONCAT12(in_stack_fffffffffffffc02,
                                                         in_stack_fffffffffffffc00))),
                       (Mat *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),in_RDI);
      ncnn::Mat::~Mat((Mat *)0x607be0);
    }
    ncnn::Mat::Mat(&local_1f0);
    make_padding((ConvolutionDepthWise *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,
                 (Option *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffaf0);
    if (bVar1) {
      local_60 = -100;
      local_1f4 = 1;
    }
    else {
      local_84 = local_1f0.w;
      local_88 = local_1f0.h;
      local_1f8 = (local_1f0.w - local_9c) / *(int *)&in_RDI[3].use_int8_packed + 1;
      local_1fc = (local_1f0.h - local_a0) / *(int *)&in_RDI[3].use_shader_pack8 + 1;
      local_200 = *(int *)((long)&in_RDI[3].workspace_allocator + 4) * in_RDI[3].openmp_blocktime;
      std::allocator<int>::allocator((allocator<int> *)0x607d10);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10,
                 in_stack_fffffffffffffb08,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      std::allocator<int>::~allocator((allocator<int> *)0x607d3c);
      local_228 = std::vector<int,_std::allocator<int>_>::operator[](&local_218,0);
      local_22c = 0;
      local_230 = 0;
      local_234 = local_84 * *(int *)&in_RDI[3].use_bf16_storage -
                  *(int *)((long)&in_RDI[3].workspace_allocator + 4) *
                  *(int *)&in_RDI[3].use_winograd_convolution;
      for (local_238 = 0; local_238 < in_RDI[3].openmp_blocktime; local_238 = local_238 + 1) {
        for (local_23c = 0; local_23c < *(int *)((long)&in_RDI[3].workspace_allocator + 4);
            local_23c = local_23c + 1) {
          local_228[local_22c] = local_230;
          local_22c = local_22c + 1;
          local_230 = *(int *)&in_RDI[3].use_winograd_convolution + local_230;
        }
        local_230 = local_234 + local_230;
      }
      local_23d = 100 < *(int *)((long)&in_RDI[4].blob_allocator + 4);
      local_248 = (ulong)(((byte)~local_23d & 1) * 3 + 1);
      ncnn::Mat::create(in_stack_fffffffffffffb10,(int)(in_stack_fffffffffffffb08 >> 0x20),
                        (int)in_stack_fffffffffffffb08,(int)in_stack_fffffffffffffb04,
                        CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                        (Allocator *)in_stack_fffffffffffffaf0);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffaf0);
      if (bVar1) {
        local_60 = -100;
      }
      else {
        if ((local_8c == *(int *)&in_RDI[4].blob_allocator) &&
           (*(int *)&in_RDI[4].blob_allocator == *(int *)&in_RDI[3].workspace_allocator)) {
          for (local_24c = 0; local_24c < *(int *)&in_RDI[4].blob_allocator;
              local_24c = local_24c + 1) {
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                               (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
            pfVar3 = (float *)ncnn::Mat::operator_cast_to_signed_char_(&local_2a0);
            ncnn::Mat::~Mat((Mat *)0x607fef);
            local_258 = pfVar3;
            local_2a8 = ncnn::Mat::operator_cast_to_signed_char_((Mat *)&in_RDI[5].use_shader_pack8)
            ;
            local_2a8 = local_2a8 + local_200 * local_24c;
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                               (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
            for (local_2f4 = 0; local_2f4 < local_1fc; local_2f4 = local_2f4 + 1) {
              for (local_2f8 = 0; local_2f8 < local_1f8; local_2f8 = local_2f8 + 1) {
                local_2fc = 0;
                local_308 = ncnn::Mat::row<signed_char>
                                      (&local_2f0,local_2f4 * *(int *)&in_RDI[3].use_shader_pack8);
                local_308 = local_308 + local_2f8 * *(int *)&in_RDI[3].use_int8_packed;
                for (local_30c = 0; local_30c < local_200; local_30c = local_30c + 1) {
                  local_30d = local_308[local_228[local_30c]];
                  local_30e = local_2a8[local_30c];
                  local_2fc = (int)local_30d * (int)local_30e + local_2fc;
                }
                pfVar3 = ncnn::Mat::operator[]((Mat *)&in_RDI[7].use_reserved_4,(long)local_24c);
                if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
                  pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 9),(long)local_24c);
                  fVar10 = *pfVar3;
                  pfVar3 = ncnn::Mat::operator[]((Mat *)&in_RDI[7].use_reserved_4,(long)local_24c);
                  local_314 = 1.0 / (fVar10 * *pfVar3);
                }
                else {
                  local_314 = 0.0;
                }
                local_318 = (float)local_2fc * local_314;
                if (*(int *)(in_RDI + 4) != 0) {
                  pfVar3 = ncnn::Mat::operator[]((Mat *)&in_RDI[6].flush_denormals,(long)local_24c);
                  local_318 = *pfVar3 + local_318;
                }
                fVar10 = local_318;
                local_8 = *(undefined4 *)&in_RDI[4].workspace_allocator;
                local_10 = (Mat *)&in_RDI[4].openmp_blocktime;
                local_4 = local_318;
                switch(local_8) {
                case 1:
                  dVar5 = std::fmax((double)(ulong)(uint)local_318,0.0);
                  local_4 = SUB84(dVar5,0);
                  break;
                case 2:
                  pfVar3 = ncnn::Mat::operator[](local_10,0);
                  local_14 = *pfVar3;
                  if (local_4 <= 0.0) {
                    local_494 = local_4 * local_14;
                  }
                  else {
                    local_494 = local_4;
                  }
                  local_4 = local_494;
                  break;
                case 3:
                  pfVar3 = ncnn::Mat::operator[](local_10,0);
                  local_18 = *pfVar3;
                  pfVar3 = ncnn::Mat::operator[](local_10,1);
                  local_1c = *pfVar3;
                  if (local_4 < local_18) {
                    local_4 = local_18;
                  }
                  if (local_1c < local_4) {
                    local_4 = local_1c;
                  }
                  break;
                case 4:
                  dVar5 = std::exp((double)(ulong)(uint)-local_318);
                  local_4 = 1.0 / (SUB84(dVar5,0) + 1.0);
                  break;
                case 5:
                  auVar6._0_8_ = std::exp((double)(ulong)(uint)local_318);
                  auVar6._8_8_ = extraout_XMM0_Qb;
                  auVar7._4_12_ = auVar6._4_12_;
                  auVar7._0_4_ = SUB84(auVar6._0_8_,0) + 1.0;
                  dVar5 = std::log(auVar7._0_8_);
                  dVar5 = std::tanh(dVar5);
                  local_4 = fVar10 * SUB84(dVar5,0);
                  break;
                case 6:
                  pfVar3 = ncnn::Mat::operator[](local_10,0);
                  local_20 = *pfVar3;
                  pfVar3 = ncnn::Mat::operator[](local_10,1);
                  local_24 = *pfVar3;
                  local_28 = -local_24 / local_20;
                  local_2c = 1.0 / local_20 + local_28;
                  if (local_28 <= local_4) {
                    if (local_4 <= local_2c) {
                      local_4 = local_4 * (local_4 * local_20 + local_24);
                    }
                  }
                  else {
                    local_4 = 0.0;
                  }
                }
                local_318 = local_4;
                if ((local_23d & 1) == 0) {
                  *local_258 = local_4;
                  local_258 = local_258 + 1;
                }
                else {
                  pfVar3 = ncnn::Mat::operator[]((Mat *)&in_RDI[10].blob_allocator,(long)local_24c);
                  local_31c = *pfVar3;
                  local_31d = float2int8(SUB84(in_stack_fffffffffffffaf0,0));
                  *(char *)local_258 = local_31d;
                  local_258 = (float *)((long)local_258 + 1);
                }
              }
            }
            ncnn::Mat::~Mat((Mat *)0x608763);
          }
        }
        else {
          local_324 = local_8c / *(int *)&in_RDI[4].blob_allocator;
          local_328 = *(int *)&in_RDI[3].workspace_allocator / *(int *)&in_RDI[4].blob_allocator;
          for (local_32c = 0; local_32c < *(int *)&in_RDI[4].blob_allocator;
              local_32c = local_32c + 1) {
            for (local_330 = 0; local_330 < local_328; local_330 = local_330 + 1) {
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18
                                                ),(int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
              pfVar3 = (float *)ncnn::Mat::operator_cast_to_signed_char_(&local_380);
              ncnn::Mat::~Mat((Mat *)0x608846);
              local_338 = pfVar3;
              local_388 = ncnn::Mat::operator_cast_to_signed_char_
                                    ((Mat *)&in_RDI[5].use_shader_pack8);
              local_388 = local_388 + local_200 * local_324 * local_328 * local_32c;
              for (local_38c = 0; local_38c < local_1fc; local_38c = local_38c + 1) {
                for (local_390 = 0; local_390 < local_1f8; local_390 = local_390 + 1) {
                  local_394 = 0;
                  local_3a0 = local_388 + local_200 * local_324 * local_330;
                  for (local_3a4 = 0; local_3a4 < local_324; local_3a4 = local_3a4 + 1) {
                    ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb1c,
                                                       in_stack_fffffffffffffb18),
                                       (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
                    pcVar4 = ncnn::Mat::row<signed_char>
                                       (&local_3f0,local_38c * *(int *)&in_RDI[3].use_shader_pack8);
                    for (iVar11 = 0; iVar11 < local_200; iVar11 = iVar11 + 1) {
                      local_394 = (int)pcVar4[(long)local_228[iVar11] +
                                              (long)(local_390 * *(int *)&in_RDI[3].use_int8_packed)
                                             ] * (int)local_3a0[iVar11] + local_394;
                    }
                    local_3a0 = local_3a0 + local_200;
                    ncnn::Mat::~Mat((Mat *)0x608ac7);
                  }
                  pfVar3 = ncnn::Mat::operator[]((Mat *)&in_RDI[7].use_reserved_4,(long)local_32c);
                  if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
                    pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 9),(long)local_32c);
                    in_stack_fffffffffffffb1c = *pfVar3;
                    pfVar3 = ncnn::Mat::operator[]((Mat *)&in_RDI[7].use_reserved_4,(long)local_32c)
                    ;
                    fVar10 = 1.0 / (in_stack_fffffffffffffb1c * *pfVar3);
                  }
                  else {
                    fVar10 = 0.0;
                  }
                  fVar10 = (float)local_394 * fVar10;
                  if (*(int *)(in_RDI + 4) != 0) {
                    in_stack_fffffffffffffb10 =
                         (Mat *)ncnn::Mat::operator[]
                                          ((Mat *)&in_RDI[6].flush_denormals,
                                           (long)(local_32c * local_328 + local_330));
                    fVar10 = *(float *)&in_stack_fffffffffffffb10->data + fVar10;
                  }
                  local_34 = *(undefined4 *)&in_RDI[4].workspace_allocator;
                  local_40 = (Mat *)&in_RDI[4].openmp_blocktime;
                  local_30 = fVar10;
                  switch(local_34) {
                  case 1:
                    dVar5 = std::fmax((double)(ulong)(uint)fVar10,0.0);
                    local_30 = SUB84(dVar5,0);
                    break;
                  case 2:
                    pfVar3 = ncnn::Mat::operator[](local_40,0);
                    local_44 = *pfVar3;
                    in_stack_fffffffffffffb04 = local_30;
                    if (local_30 <= 0.0) {
                      local_30 = local_30 * local_44;
                      in_stack_fffffffffffffb04 = local_30;
                    }
                    break;
                  case 3:
                    pfVar3 = ncnn::Mat::operator[](local_40,0);
                    local_48 = *pfVar3;
                    pfVar3 = ncnn::Mat::operator[](local_40,1);
                    local_4c = *pfVar3;
                    if (local_30 < local_48) {
                      local_30 = local_48;
                    }
                    if (local_4c < local_30) {
                      local_30 = local_4c;
                    }
                    break;
                  case 4:
                    dVar5 = std::exp((double)(ulong)(uint)-fVar10);
                    local_30 = 1.0 / (SUB84(dVar5,0) + 1.0);
                    break;
                  case 5:
                    auVar8._0_8_ = std::exp((double)(ulong)(uint)fVar10);
                    auVar8._8_8_ = extraout_XMM0_Qb_00;
                    auVar9._4_12_ = auVar8._4_12_;
                    auVar9._0_4_ = SUB84(auVar8._0_8_,0) + 1.0;
                    dVar5 = std::log(auVar9._0_8_);
                    dVar5 = std::tanh(dVar5);
                    local_30 = fVar10 * SUB84(dVar5,0);
                    in_stack_fffffffffffffb00 = fVar10;
                    break;
                  case 6:
                    pfVar3 = ncnn::Mat::operator[](local_40,0);
                    local_50 = *pfVar3;
                    pfVar3 = ncnn::Mat::operator[](local_40,1);
                    local_54 = *pfVar3;
                    local_58 = -local_54 / local_50;
                    local_5c = 1.0 / local_50 + local_58;
                    if (local_58 <= local_30) {
                      if (local_30 <= local_5c) {
                        local_30 = local_30 * (local_30 * local_50 + local_54);
                      }
                    }
                    else {
                      local_30 = 0.0;
                    }
                  }
                  if ((local_23d & 1) == 0) {
                    *local_338 = local_30;
                    local_338 = local_338 + 1;
                  }
                  else {
                    pfVar3 = ncnn::Mat::operator[]
                                       ((Mat *)&in_RDI[10].blob_allocator,(long)local_32c);
                    cVar2 = float2int8(SUB84(pfVar3,0));
                    *(char *)local_338 = cVar2;
                    local_338 = (float *)((long)local_338 + 1);
                  }
                }
              }
            }
          }
        }
        local_60 = 0;
      }
      local_1f4 = 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    }
    ncnn::Mat::~Mat((Mat *)0x60909d);
    ncnn::Mat::~Mat((Mat *)0x6090aa);
  }
  else {
    local_60 = -100;
  }
  return local_60;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        const int channels_g = channels / group;

        Mat scales(channels);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    float scale_in;
                    if (weight_data_int8_scales[g] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[g];

                    sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                    if (use_int8_requantize)
                    {
                        // requantize
                        float scale_out = top_blob_int8_scales[g];
                        signed char sums8 = float2int8(sumfp32 * scale_out);
                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize
                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g * num_output_g + p];

                        sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                        if (use_int8_requantize)
                        {
                            // requantize
                            float scale_out = top_blob_int8_scales[g];
                            signed char sums8 = float2int8(sumfp32 * scale_out);
                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize
                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}